

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O2

CURLcode Curl_sasl_start(SASL *sasl,Curl_easy *data,_Bool force_ir,saslprogress *progress)

{
  connectdata *pcVar1;
  ushort uVar2;
  _Bool _Var3;
  CURLcode CVar4;
  uchar *puVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  saslstate sVar9;
  saslstate sVar10;
  bufref resp;
  int port;
  saslprogress *local_68;
  char *hostname;
  char *local_58;
  char *disp_hostname;
  bufref nullmsg;
  
  pcVar8 = (data->set).str[0xc];
  if (pcVar8 == (char *)0x0) {
    pcVar8 = sasl->params->service;
  }
  pcVar1 = data->conn;
  local_58 = (data->set).str[0x3c];
  Curl_conn_get_host(data,0,&hostname,&disp_hostname,&port);
  Curl_bufref_init(&nullmsg);
  Curl_bufref_init(&resp);
  sasl->field_0x1e = sasl->field_0x1e & 0xfb | force_ir * '\x04';
  sasl->authused = 0;
  uVar2 = sasl->prefmech & sasl->authmechs;
  *progress = SASL_IDLE;
  if (((uVar2 & 0x20) == 0) || (*pcVar1->passwd != '\0')) {
    CVar4 = CURLE_OK;
    if ((data->state).aptr.user == (char *)0x0) goto LAB_0011f6dd;
    local_68 = progress;
    if ((uVar2 & 8) != 0) {
      _Var3 = Curl_auth_is_digest_supported();
      if (_Var3) {
        sasl->authused = 8;
        sVar9 = SASL_DIGESTMD5;
        sVar10 = SASL_FINAL;
        pcVar8 = "DIGEST-MD5";
        goto LAB_0011f63d;
      }
    }
    if ((uVar2 & 4) == 0) {
      if ((uVar2 & 0x40) == 0) {
LAB_0011f4b5:
        if ((local_58 != (char *)0x0 & (byte)(uVar2 >> 8)) == 1) {
          sasl->authused = 0x100;
          if ((force_ir) || (((data->set).field_0x8ce & 0x20) != 0)) {
            CVar4 = Curl_auth_create_oauth_bearer_message
                              (pcVar1->user,hostname,(long)port,local_58,&resp);
            pcVar8 = "OAUTHBEARER";
            sVar10 = SASL_OAUTH2_RESP;
LAB_0011f62f:
            sVar9 = SASL_OAUTH2;
            goto LAB_0011f633;
          }
          sVar10 = SASL_OAUTH2_RESP;
          sVar9 = SASL_OAUTH2;
          pcVar8 = "OAUTHBEARER";
        }
        else if ((char)uVar2 < '\0' && local_58 != (char *)0x0) {
          sasl->authused = 0x80;
          if ((force_ir) || (((data->set).field_0x8ce & 0x20) != 0)) {
            CVar4 = Curl_auth_create_xoauth_bearer_message(pcVar1->user,local_58,&resp);
            pcVar8 = "XOAUTH2";
            sVar10 = SASL_FINAL;
            goto LAB_0011f62f;
          }
          sVar9 = SASL_OAUTH2;
          sVar10 = SASL_FINAL;
          pcVar8 = "XOAUTH2";
        }
        else if ((uVar2 & 2) == 0) {
          CVar4 = CURLE_OK;
          if ((uVar2 & 1) == 0) goto LAB_0011f6dd;
          sasl->authused = 1;
          sVar9 = SASL_LOGIN;
          sVar10 = SASL_LOGIN_PASSWD;
          if ((force_ir) || (((data->set).field_0x8ce & 0x20) != 0)) {
            Curl_auth_create_login_message(pcVar1->user,&resp);
          }
          pcVar8 = "LOGIN";
        }
        else {
          sasl->authused = 2;
          if ((force_ir) || (((data->set).field_0x8ce & 0x20) != 0)) {
            CVar4 = Curl_auth_create_plain_message
                              (pcVar1->sasl_authzid,pcVar1->user,pcVar1->passwd,&resp);
            pcVar8 = "PLAIN";
            sVar10 = SASL_FINAL;
            sVar9 = SASL_PLAIN;
            goto LAB_0011f633;
          }
          sVar9 = SASL_PLAIN;
          sVar10 = SASL_FINAL;
          pcVar8 = "PLAIN";
        }
      }
      else {
        _Var3 = Curl_auth_is_ntlm_supported();
        if (!_Var3) goto LAB_0011f4b5;
        sasl->authused = 0x40;
        if ((!force_ir) && (((data->set).field_0x8ce & 0x20) == 0)) {
          sVar10 = SASL_NTLM_TYPE2MSG;
          sVar9 = SASL_NTLM;
          pcVar8 = "NTLM";
          goto LAB_0011f63d;
        }
        CVar4 = Curl_auth_create_ntlm_type1_message
                          (data,pcVar1->user,pcVar1->passwd,pcVar8,hostname,&pcVar1->ntlm,&resp);
        pcVar8 = "NTLM";
        sVar10 = SASL_NTLM_TYPE2MSG;
        sVar9 = SASL_NTLM;
LAB_0011f633:
        if (CVar4 != CURLE_OK) goto LAB_0011f6dd;
      }
    }
    else {
      sasl->authused = 4;
      sVar9 = SASL_CRAMMD5;
      sVar10 = SASL_FINAL;
      pcVar8 = "CRAM-MD5";
    }
  }
  else {
    sasl->authused = 0x20;
    sVar9 = SASL_EXTERNAL;
    sVar10 = SASL_FINAL;
    if ((force_ir) || (local_68 = progress, ((data->set).field_0x8ce & 0x20) != 0)) {
      local_68 = progress;
      Curl_auth_create_external_message(pcVar1->user,&resp);
    }
    pcVar8 = "EXTERNAL";
  }
LAB_0011f63d:
  sasl->curmech = pcVar8;
  puVar5 = Curl_bufref_ptr(&resp);
  if (puVar5 == (uchar *)0x0) {
    CVar4 = CURLE_OK;
  }
  else {
    CVar4 = build_message(sasl,&resp);
  }
  if (sasl->params->maxirlen != 0) {
    sVar6 = strlen(pcVar8);
    sVar7 = Curl_bufref_len(&resp);
    if (sasl->params->maxirlen < sVar7 + sVar6) {
      Curl_bufref_free(&resp);
    }
  }
  if (CVar4 == CURLE_OK) {
    CVar4 = (*sasl->params->sendauth)(data,pcVar8,&resp);
    if (CVar4 == CURLE_OK) {
      *local_68 = SASL_INPROGRESS;
      puVar5 = Curl_bufref_ptr(&resp);
      if (puVar5 == (uchar *)0x0) {
        sVar10 = sVar9;
      }
      sasl->state = sVar10;
      CVar4 = CURLE_OK;
    }
  }
LAB_0011f6dd:
  Curl_bufref_free(&resp);
  return CVar4;
}

Assistant:

CURLcode Curl_sasl_start(struct SASL *sasl, struct Curl_easy *data,
                         bool force_ir, saslprogress *progress)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  unsigned short enabledmechs;
  const char *mech = NULL;
  struct bufref resp;
  saslstate state1 = SASL_STOP;
  saslstate state2 = SASL_FINAL;
  const char *hostname, *disp_hostname;
  int port;
#if defined(USE_KERBEROS5) || defined(USE_NTLM)
  const char *service = data->set.str[STRING_SERVICE_NAME] ?
    data->set.str[STRING_SERVICE_NAME] :
    sasl->params->service;
#endif
  const char *oauth_bearer = data->set.str[STRING_BEARER];
  struct bufref nullmsg;

  Curl_conn_get_host(data, FIRSTSOCKET, &hostname, &disp_hostname, &port);
  Curl_bufref_init(&nullmsg);
  Curl_bufref_init(&resp);
  sasl->force_ir = force_ir;    /* Latch for future use */
  sasl->authused = 0;           /* No mechanism used yet */
  enabledmechs = sasl->authmechs & sasl->prefmech;
  *progress = SASL_IDLE;

  /* Calculate the supported authentication mechanism, by decreasing order of
     security, as well as the initial response where appropriate */
  if((enabledmechs & SASL_MECH_EXTERNAL) && !conn->passwd[0]) {
    mech = SASL_MECH_STRING_EXTERNAL;
    state1 = SASL_EXTERNAL;
    sasl->authused = SASL_MECH_EXTERNAL;

    if(force_ir || data->set.sasl_ir)
      Curl_auth_create_external_message(conn->user, &resp);
  }
  else if(data->state.aptr.user) {
#if defined(USE_KERBEROS5)
    if((enabledmechs & SASL_MECH_GSSAPI) && Curl_auth_is_gssapi_supported() &&
       Curl_auth_user_contains_domain(conn->user)) {
      sasl->mutual_auth = FALSE;
      mech = SASL_MECH_STRING_GSSAPI;
      state1 = SASL_GSSAPI;
      state2 = SASL_GSSAPI_TOKEN;
      sasl->authused = SASL_MECH_GSSAPI;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_gssapi_user_message(data, conn->user,
                                                      conn->passwd,
                                                      service,
                                                      conn->host.name,
                                                      sasl->mutual_auth,
                                                      NULL, &conn->krb5,
                                                      &resp);
    }
    else
#endif
#ifdef USE_GSASL
    if((enabledmechs & SASL_MECH_SCRAM_SHA_256) &&
       Curl_auth_gsasl_is_supported(data, SASL_MECH_STRING_SCRAM_SHA_256,
                                    &conn->gsasl)) {
      mech = SASL_MECH_STRING_SCRAM_SHA_256;
      sasl->authused = SASL_MECH_SCRAM_SHA_256;
      state1 = SASL_GSASL;
      state2 = SASL_GSASL;

      result = Curl_auth_gsasl_start(data, conn->user,
                                     conn->passwd, &conn->gsasl);
      if(result == CURLE_OK && (force_ir || data->set.sasl_ir))
        result = Curl_auth_gsasl_token(data, &nullmsg, &conn->gsasl, &resp);
    }
    else if((enabledmechs & SASL_MECH_SCRAM_SHA_1) &&
            Curl_auth_gsasl_is_supported(data, SASL_MECH_STRING_SCRAM_SHA_1,
                                         &conn->gsasl)) {
      mech = SASL_MECH_STRING_SCRAM_SHA_1;
      sasl->authused = SASL_MECH_SCRAM_SHA_1;
      state1 = SASL_GSASL;
      state2 = SASL_GSASL;

      result = Curl_auth_gsasl_start(data, conn->user,
                                     conn->passwd, &conn->gsasl);
      if(result == CURLE_OK && (force_ir || data->set.sasl_ir))
        result = Curl_auth_gsasl_token(data, &nullmsg, &conn->gsasl, &resp);
    }
    else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
    if((enabledmechs & SASL_MECH_DIGEST_MD5) &&
       Curl_auth_is_digest_supported()) {
      mech = SASL_MECH_STRING_DIGEST_MD5;
      state1 = SASL_DIGESTMD5;
      sasl->authused = SASL_MECH_DIGEST_MD5;
    }
    else if(enabledmechs & SASL_MECH_CRAM_MD5) {
      mech = SASL_MECH_STRING_CRAM_MD5;
      state1 = SASL_CRAMMD5;
      sasl->authused = SASL_MECH_CRAM_MD5;
    }
    else
#endif
#ifdef USE_NTLM
    if((enabledmechs & SASL_MECH_NTLM) && Curl_auth_is_ntlm_supported()) {
      mech = SASL_MECH_STRING_NTLM;
      state1 = SASL_NTLM;
      state2 = SASL_NTLM_TYPE2MSG;
      sasl->authused = SASL_MECH_NTLM;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_ntlm_type1_message(data,
                                                     conn->user, conn->passwd,
                                                     service,
                                                     hostname,
                                                     &conn->ntlm, &resp);
      }
    else
#endif
    if((enabledmechs & SASL_MECH_OAUTHBEARER) && oauth_bearer) {
      mech = SASL_MECH_STRING_OAUTHBEARER;
      state1 = SASL_OAUTH2;
      state2 = SASL_OAUTH2_RESP;
      sasl->authused = SASL_MECH_OAUTHBEARER;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_oauth_bearer_message(conn->user,
                                                       hostname,
                                                       port,
                                                       oauth_bearer,
                                                       &resp);
    }
    else if((enabledmechs & SASL_MECH_XOAUTH2) && oauth_bearer) {
      mech = SASL_MECH_STRING_XOAUTH2;
      state1 = SASL_OAUTH2;
      sasl->authused = SASL_MECH_XOAUTH2;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_xoauth_bearer_message(conn->user,
                                                        oauth_bearer,
                                                        &resp);
    }
    else if(enabledmechs & SASL_MECH_PLAIN) {
      mech = SASL_MECH_STRING_PLAIN;
      state1 = SASL_PLAIN;
      sasl->authused = SASL_MECH_PLAIN;

      if(force_ir || data->set.sasl_ir)
        result = Curl_auth_create_plain_message(conn->sasl_authzid,
                                                conn->user, conn->passwd,
                                                &resp);
    }
    else if(enabledmechs & SASL_MECH_LOGIN) {
      mech = SASL_MECH_STRING_LOGIN;
      state1 = SASL_LOGIN;
      state2 = SASL_LOGIN_PASSWD;
      sasl->authused = SASL_MECH_LOGIN;

      if(force_ir || data->set.sasl_ir)
        Curl_auth_create_login_message(conn->user, &resp);
    }
  }

  if(!result && mech) {
    sasl->curmech = mech;
    if(Curl_bufref_ptr(&resp))
      result = build_message(sasl, &resp);

    if(sasl->params->maxirlen &&
       strlen(mech) + Curl_bufref_len(&resp) > sasl->params->maxirlen)
      Curl_bufref_free(&resp);

    if(!result)
      result = sasl->params->sendauth(data, mech, &resp);

    if(!result) {
      *progress = SASL_INPROGRESS;
      sasl_state(sasl, data, Curl_bufref_ptr(&resp) ? state2 : state1);
    }
  }

  Curl_bufref_free(&resp);
  return result;
}